

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O1

void __thiscall QOpenGL2PaintEngineExPrivate::resetClipIfNeeded(QOpenGL2PaintEngineExPrivate *this)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  QRectF local_98;
  QOpenGLRect local_78 [5];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->maxClip == 0x7f) {
    lVar1 = *(long *)&this->field_0x10;
    QOpenGLEngineShaderManager::useSimpleProgram((QOpenGLEngineShaderManager *)this->shaderManager);
    if (this->matrixDirty == true) {
      updateMatrix(this);
    }
    (**(code **)(*(long *)&this->funcs + 0x88))(0xb90);
    (**(code **)(*(long *)&this->funcs + 0x30))(0,0,0,0);
    local_98.w._0_4_ = 0xffffffff;
    local_98.w._4_4_ = 0xffffffff;
    local_98.h._0_4_ = 0xffffffff;
    local_98.h._4_4_ = 0xffffffff;
    local_98.xp._0_4_ = 0xffffffff;
    local_98.xp._4_4_ = 0xffffffff;
    local_98.yp._0_4_ = 0xffffffff;
    local_98.yp._4_4_ = 0xffffffff;
    QTransform::inverted((bool *)local_78);
    QTransform::mapRect(&local_98);
    local_78[0].left = (float)(double)CONCAT44(local_98.xp._4_4_,local_98.xp._0_4_);
    local_78[0].top = (float)(double)CONCAT44(local_98.yp._4_4_,local_98.yp._0_4_);
    local_78[0].right =
         (float)((double)CONCAT44(local_98.w._4_4_,local_98.w._0_4_) +
                (double)CONCAT44(local_98.xp._4_4_,local_98.xp._0_4_));
    local_78[0].bottom =
         (float)((double)CONCAT44(local_98.h._4_4_,local_98.h._0_4_) +
                (double)CONCAT44(local_98.yp._4_4_,local_98.yp._0_4_));
    lVar2 = *(long *)(lVar1 + 8) + -8;
    if (*(long *)(lVar1 + 8) == 0) {
      lVar2 = 0;
    }
    (**(code **)(*(long *)&this->funcs + 0x128))(0x203,*(uint *)(lVar2 + 0x1c0) >> 9 & 0xff,0xff);
    (**(code **)(*(long *)&this->funcs + 0x138))(0x1e00,0x150a,0x150a);
    (**(code **)(*(long *)&this->funcs + 0x130))(0x80);
    composite(this,local_78);
    (**(code **)(*(long *)&this->funcs + 0x128))(0x205,1,0x80);
    (**(code **)(*(long *)&this->funcs + 0x138))(0,0x1e01,0x1e01);
    (**(code **)(*(long *)&this->funcs + 0x130))(0xff);
    composite(this,local_78);
    lVar2 = *(long *)(lVar1 + 8) + -8;
    if (*(long *)(lVar1 + 8) == 0) {
      lVar2 = 0;
    }
    *(uint *)(lVar2 + 0x1c0) = *(uint *)(lVar2 + 0x1c0) & 0xfffe01ff | 0x200;
    lVar2 = *(long *)(lVar1 + 8) + -8;
    if (*(long *)(lVar1 + 8) == 0) {
      lVar2 = 0;
    }
    *(uint *)(lVar2 + 0x1c0) = *(uint *)(lVar2 + 0x1c0) & 0xfffffff7;
    this->maxClip = 1;
    (**(code **)(*(long *)&this->funcs + 0x130))(0);
    (**(code **)(*(long *)&this->funcs + 0x30))(1,1,1,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::resetClipIfNeeded()
{
    if (maxClip != (GL_STENCIL_HIGH_BIT - 1))
        return;

    Q_Q(QOpenGL2PaintEngineEx);

    useSimpleShader();
    funcs.glEnable(GL_STENCIL_TEST);
    funcs.glColorMask(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);

    QRectF bounds = q->state()->matrix.inverted().mapRect(QRectF(0, 0, width, height));
    QOpenGLRect rect(bounds.left(), bounds.top(), bounds.right(), bounds.bottom());

    // Set high bit on clip region
    funcs.glStencilFunc(GL_LEQUAL, q->state()->currentClip, 0xff);
    funcs.glStencilOp(GL_KEEP, GL_INVERT, GL_INVERT);
    funcs.glStencilMask(GL_STENCIL_HIGH_BIT);
    composite(rect);

    // Reset clipping to 1 and everything else to zero
    funcs.glStencilFunc(GL_NOTEQUAL, 0x01, GL_STENCIL_HIGH_BIT);
    funcs.glStencilOp(GL_ZERO, GL_REPLACE, GL_REPLACE);
    funcs.glStencilMask(0xff);
    composite(rect);

    q->state()->currentClip = 1;
    q->state()->canRestoreClip = false;

    maxClip = 1;

    funcs.glStencilMask(0x0);
    funcs.glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
}